

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_strvp.c
# Opt level: O3

ares_bool_t ares_htable_strvp_insert(ares_htable_strvp_t *htable,char *key,void *val)

{
  ares_bool_t aVar1;
  undefined8 *bucket;
  char *pcVar2;
  void *p;
  
  if ((key != (char *)0x0 && htable != (ares_htable_strvp_t *)0x0) &&
     (bucket = (undefined8 *)ares_malloc(0x18), bucket != (undefined8 *)0x0)) {
    bucket[2] = htable;
    pcVar2 = ares_strdup(key);
    *bucket = pcVar2;
    p = (void *)0x0;
    if (pcVar2 != (char *)0x0) {
      bucket[1] = val;
      aVar1 = ares_htable_insert(htable->hash,bucket);
      if (aVar1 != ARES_FALSE) {
        return ARES_TRUE;
      }
      p = (void *)*bucket;
    }
    ares_free(p);
    ares_free(bucket);
  }
  return ARES_FALSE;
}

Assistant:

ares_bool_t ares_htable_strvp_insert(ares_htable_strvp_t *htable,
                                     const char *key, void *val)
{
  ares_htable_strvp_bucket_t *bucket = NULL;

  if (htable == NULL || key == NULL) {
    goto fail;
  }

  bucket = ares_malloc(sizeof(*bucket));
  if (bucket == NULL) {
    goto fail;
  }

  bucket->parent = htable;
  bucket->key    = ares_strdup(key);
  if (bucket->key == NULL) {
    goto fail;
  }
  bucket->val = val;

  if (!ares_htable_insert(htable->hash, bucket)) {
    goto fail;
  }

  return ARES_TRUE;

fail:
  if (bucket) {
    ares_free(bucket->key);
    ares_free(bucket);
  }
  return ARES_FALSE;
}